

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator(void)

{
  ncnn_allocator_t p_Var1;
  UnlockedPoolAllocator_c_api *this;
  ncnn_allocator_t allocator;
  ncnn_allocator_t _allocator;
  
  _allocator = (ncnn_allocator_t)&DAT_00000018;
  p_Var1 = (ncnn_allocator_t)malloc(0x18);
  this = (UnlockedPoolAllocator_c_api *)operator_new((ulong)_allocator);
  UnlockedPoolAllocator_c_api::UnlockedPoolAllocator_c_api(this,_allocator);
  p_Var1->pthis = this;
  p_Var1->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
  p_Var1->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
  return p_Var1;
}

Assistant:

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator()
{
    ncnn_allocator_t allocator = (ncnn_allocator_t)malloc(sizeof(struct __ncnn_allocator_t));
    allocator->pthis = (void*)(new UnlockedPoolAllocator_c_api(allocator));
    allocator->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
    allocator->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
    return allocator;
}